

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O3

void coda_base58_encode(char *in,size_t inlen,char *out,size_t outlen)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char *__ptr;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  size_t sVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  
  if (inlen != 0 && outlen != 0) {
    sVar2 = 1;
    sVar5 = inlen;
    sVar10 = outlen;
    do {
      sVar3 = sVar2;
      if (in[sVar3 - 1] != '\0') {
        out = out + (sVar3 - 1);
        in = in + (sVar3 - 1);
        inlen = sVar5;
        outlen = sVar10;
        goto LAB_00101696;
      }
      out[sVar3 - 1] = '1';
      sVar10 = sVar10 - 1;
      sVar5 = sVar5 - 1;
    } while ((outlen != sVar3) && (sVar2 = sVar3 + 1, inlen != sVar3));
    out = out + sVar3;
    in = in + sVar3;
    inlen = sVar5;
    outlen = sVar10;
  }
LAB_00101696:
  iVar11 = (int)((inlen * 0x8a) / 100);
  __ptr = (char *)calloc((ulong)(iVar11 + 1U),1);
  if (inlen != 0) {
    do {
      uVar6 = (uint)(byte)*in;
      lVar7 = (long)iVar11;
      if ((*in != 0) || (-1 < iVar11)) {
        do {
          do {
            lVar8 = lVar7;
            uVar9 = __ptr[lVar8] * 0x100 + uVar6;
            uVar6 = uVar9 / 0x3a;
            __ptr[lVar8] = (char)uVar9 + (char)(uVar9 / 0x3a) * -0x3a;
            lVar7 = lVar8 + -1;
          } while (0x39 < uVar9);
        } while (0 < lVar8);
      }
      in = (char *)((byte *)in + 1);
      inlen = inlen - 1;
    } while (inlen != 0);
  }
  if (iVar11 + 1U != 0) {
    iVar11 = -iVar11;
    pcVar4 = __ptr;
    do {
      if (*pcVar4 != '\0') {
        if (outlen == 0) {
          bVar1 = false;
          goto LAB_001017a0;
        }
        iVar11 = -iVar11;
        lVar7 = 0;
        goto LAB_00101770;
      }
      pcVar4 = pcVar4 + 1;
      iVar11 = iVar11 + 1;
    } while (iVar11 != 1);
  }
  if (outlen == 0) goto LAB_00101746;
  goto LAB_00101743;
  while (lVar7 = lVar8, bVar12) {
LAB_00101770:
    out[lVar7] = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"[(byte)pcVar4[lVar7]];
    bVar12 = iVar11 != 0;
    iVar11 = iVar11 + -1;
    lVar8 = lVar7 + 1;
    bVar13 = outlen - 1 == lVar7;
    bVar1 = !bVar13;
    if (bVar13) break;
  }
  out = out + lVar8;
LAB_001017a0:
  if (!bVar1) goto LAB_00101746;
LAB_00101743:
  *out = '\0';
LAB_00101746:
  free(__ptr);
  return;
}

Assistant:

void coda_base58_encode (const char* in, size_t inlen, char* out, size_t outlen)
{
    static const char b58str[58] = "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz";

    while (outlen && inlen && !*in)
    {
        *out++ = '1';
        outlen--;

        in++;
        inlen--;
    }

    unsigned b58len = inlen * 138 / 100 + 1; // log(256) / log(58), rounded up.
    char* b58_begin = NULL;
    char* b58_curr = NULL;
    b58_begin = b58_curr = (char*)calloc(b58len, sizeof(unsigned char));

    while (inlen)
    {
        unsigned int carry = (unsigned char)*in++;
        int i;
        for (i = b58len - 1; carry || i >= 0; i--)
        {
            carry += 256 * b58_curr[i];
            b58_curr[i] = carry % 58;
            carry /= 58;
        }
        inlen--;
    }

    // Skip leading zeroes in base58 result.
    while (b58len && !*b58_curr)
    {
        b58_curr++;
        b58len--;
    }

    while (outlen && b58len)
    {
        *out++ = b58str[(unsigned char)*b58_curr++];
        b58len--;
        outlen--;
    }

    if (outlen) *out = '\0';

    free(b58_begin);
}